

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O0

bool duckdb::DecimalDecimalCastSwitch<duckdb::hugeint_t,duckdb::Hugeint>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  PhysicalType PVar1;
  LogicalType *pLVar2;
  undefined8 uVar3;
  string *msg;
  Vector *in_RSI;
  Vector *in_RDI;
  CastParameters *in_stack_00000010;
  idx_t in_stack_00000018;
  Vector *in_stack_00000020;
  Vector *in_stack_00000028;
  Vector *in_stack_00000030;
  Vector *in_stack_00000038;
  CastParameters *in_stack_00000070;
  idx_t in_stack_00000078;
  Vector *in_stack_00000080;
  uint8_t result_scale;
  Vector *in_stack_00000088;
  uint8_t source_scale;
  string *in_stack_ffffffffffffff48;
  LogicalType *in_stack_ffffffffffffff50;
  allocator *this;
  allocator local_89;
  string local_88 [35];
  undefined1 local_65;
  allocator local_51;
  string local_50 [38];
  byte local_2a;
  byte local_29;
  Vector *local_18;
  Vector *local_10;
  bool local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  Vector::GetType(in_RDI);
  local_29 = DecimalType::GetScale(in_stack_ffffffffffffff50);
  Vector::GetType(local_18);
  local_2a = DecimalType::GetScale(in_stack_ffffffffffffff50);
  pLVar2 = Vector::GetType(local_10);
  LogicalType::Verify(pLVar2);
  pLVar2 = Vector::GetType(local_18);
  LogicalType::Verify(pLVar2);
  if (local_2a < local_29) {
    pLVar2 = Vector::GetType(local_18);
    PVar1 = LogicalType::InternalType(pLVar2);
    if (PVar1 == INT128) {
      local_1 = TemplatedDecimalScaleDown<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::Hugeint>
                          (in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000070);
    }
    else if (PVar1 == INT16) {
      local_1 = TemplatedDecimalScaleDown<duckdb::hugeint_t,short,duckdb::Hugeint>
                          (in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000070);
    }
    else if (PVar1 == INT32) {
      local_1 = TemplatedDecimalScaleDown<duckdb::hugeint_t,int,duckdb::Hugeint>
                          (in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000070);
    }
    else {
      if (PVar1 != INT64) {
        msg = (string *)__cxa_allocate_exception(0x10);
        this = &local_89;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_88,"Unimplemented internal type for decimal",this);
        NotImplementedException::NotImplementedException((NotImplementedException *)this,msg);
        __cxa_throw(msg,&NotImplementedException::typeinfo,
                    NotImplementedException::~NotImplementedException);
      }
      local_1 = TemplatedDecimalScaleDown<duckdb::hugeint_t,long,duckdb::Hugeint>
                          (in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000070);
    }
  }
  else {
    pLVar2 = Vector::GetType(local_18);
    PVar1 = LogicalType::InternalType(pLVar2);
    if (PVar1 == INT128) {
      local_1 = TemplatedDecimalScaleUp<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::Hugeint,duckdb::Hugeint>
                          (in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000070);
    }
    else if (PVar1 == INT16) {
      local_1 = TemplatedDecimalScaleUp<duckdb::hugeint_t,short,duckdb::Hugeint,duckdb::NumericHelper>
                          (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010);
    }
    else if (PVar1 == INT32) {
      local_1 = TemplatedDecimalScaleUp<duckdb::hugeint_t,int,duckdb::Hugeint,duckdb::NumericHelper>
                          (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010);
    }
    else {
      if (PVar1 != INT64) {
        local_65 = 1;
        uVar3 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_50,"Unimplemented internal type for decimal",&local_51)
        ;
        NotImplementedException::NotImplementedException
                  ((NotImplementedException *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        local_65 = 0;
        __cxa_throw(uVar3,&NotImplementedException::typeinfo,
                    NotImplementedException::~NotImplementedException);
      }
      local_1 = TemplatedDecimalScaleUp<duckdb::hugeint_t,long,duckdb::Hugeint,duckdb::NumericHelper>
                          (in_stack_00000038,in_stack_00000030,(idx_t)in_stack_00000028,
                           (CastParameters *)in_stack_00000020);
    }
  }
  return local_1;
}

Assistant:

static bool DecimalDecimalCastSwitch(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto source_scale = DecimalType::GetScale(source.GetType());
	auto result_scale = DecimalType::GetScale(result.GetType());
	source.GetType().Verify();
	result.GetType().Verify();

	// we need to either multiply or divide by the difference in scales
	if (result_scale >= source_scale) {
		// multiply
		switch (result.GetType().InternalType()) {
		case PhysicalType::INT16:
			return TemplatedDecimalScaleUp<SOURCE, int16_t, POWERS_SOURCE, NumericHelper>(source, result, count,
			                                                                              parameters);
		case PhysicalType::INT32:
			return TemplatedDecimalScaleUp<SOURCE, int32_t, POWERS_SOURCE, NumericHelper>(source, result, count,
			                                                                              parameters);
		case PhysicalType::INT64:
			return TemplatedDecimalScaleUp<SOURCE, int64_t, POWERS_SOURCE, NumericHelper>(source, result, count,
			                                                                              parameters);
		case PhysicalType::INT128:
			return TemplatedDecimalScaleUp<SOURCE, hugeint_t, POWERS_SOURCE, Hugeint>(source, result, count,
			                                                                          parameters);
		default:
			throw NotImplementedException("Unimplemented internal type for decimal");
		}
	} else {
		// divide
		switch (result.GetType().InternalType()) {
		case PhysicalType::INT16:
			return TemplatedDecimalScaleDown<SOURCE, int16_t, POWERS_SOURCE>(source, result, count, parameters);
		case PhysicalType::INT32:
			return TemplatedDecimalScaleDown<SOURCE, int32_t, POWERS_SOURCE>(source, result, count, parameters);
		case PhysicalType::INT64:
			return TemplatedDecimalScaleDown<SOURCE, int64_t, POWERS_SOURCE>(source, result, count, parameters);
		case PhysicalType::INT128:
			return TemplatedDecimalScaleDown<SOURCE, hugeint_t, POWERS_SOURCE>(source, result, count, parameters);
		default:
			throw NotImplementedException("Unimplemented internal type for decimal");
		}
	}
}